

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O3

LLVMValueRef CompileLlvmFunctionCall(LlvmCompilationContext *ctx,ExprFunctionCall *node)

{
  LLVMValueRef pLVar1;
  ulong uVar2;
  TypeBase *argumentType;
  ExprBase *value;
  TypeFunction *functionType;
  SmallArray<LLVMValueRefOpaque_*,_32U> arguments;
  SmallArray<LLVMValueRefOpaque_*,_32U> local_148;
  
  argumentType = (TypeBase *)node->function;
  functionType = (TypeFunction *)(argumentType->name).end;
  if ((functionType == (TypeFunction *)0x0) || ((functionType->super_TypeBase).typeID != 0x15)) {
    functionType = (TypeFunction *)0x0;
  }
  CompileLlvm(ctx,(ExprBase *)argumentType);
  local_148.allocator = ctx->allocator;
  local_148.data = local_148.little;
  local_148.count = 0;
  local_148.max = 0x20;
  value = (node->arguments).head;
  if (value != (ExprBase *)0x0) {
    do {
      pLVar1 = CompileArgument(ctx,argumentType,value);
      if (local_148.count == local_148.max) {
        SmallArray<LLVMValueRefOpaque_*,_32U>::grow(&local_148,local_148.count);
      }
      if (local_148.data == (LLVMValueRefOpaque **)0x0) goto LAB_0019422c;
      uVar2 = (ulong)local_148.count;
      local_148.count = local_148.count + 1;
      argumentType = (TypeBase *)(ulong)local_148.count;
      local_148.data[uVar2] = pLVar1;
      value = value->next;
    } while (value != (ExprBase *)0x0);
    if (local_148.count == local_148.max) {
      SmallArray<LLVMValueRefOpaque_*,_32U>::grow(&local_148,local_148.count);
    }
  }
  if (local_148.data != (LLVMValueRefOpaque **)0x0) {
    uVar2 = (ulong)local_148.count;
    local_148.count = local_148.count + 1;
    local_148.data[uVar2] = (LLVMValueRefOpaque *)&placeholderValue;
    CompileLlvmFunctionType(ctx,functionType);
    pLVar1 = ConvertToStackType(ctx,(LLVMValueRef)&placeholderValue,(node->super_ExprBase).type);
    CheckType(ctx,&node->super_ExprBase,pLVar1);
    SmallArray<LLVMValueRefOpaque_*,_32U>::~SmallArray(&local_148);
    return pLVar1;
  }
LAB_0019422c:
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,
                "void SmallArray<LLVMValueRefOpaque *, 32>::push_back(const T &) [T = LLVMValueRefOpaque *, N = 32]"
               );
}

Assistant:

LLVMValueRef CompileLlvmFunctionCall(LlvmCompilationContext &ctx, ExprFunctionCall *node)
{
	TypeFunction *typeFunction = getType<TypeFunction>(node->function->type);

	LLVMValueRef function = CompileLlvm(ctx, node->function);

	SmallArray<LLVMValueRef, 32> arguments(ctx.allocator);

	bool isStructReturnType = IsStructReturnType(typeFunction->returnType);
	LLVMValueRef resultStorage = NULL;

	if(isStructReturnType)
	{
		resultStorage = LLVMBuildAlloca(ctx.builder, CompileLlvmType(ctx, typeFunction->returnType), "call_return_storage");

		arguments.push_back(resultStorage);
	}

	TypeHandle *argumentType = typeFunction->arguments.head;

	for(ExprBase *value = node->arguments.head; value; value = value->next)
	{
		arguments.push_back(CompileArgument(ctx, argumentType->type, value));

		argumentType = argumentType->next;
	}

	arguments.push_back(LLVMBuildExtractValue(ctx.builder, function, 0, "context"));

	LLVMValueRef functionRef = LLVMBuildExtractValue(ctx.builder, function, 1, "function");

	LLVMTypeRef functionType = LLVMPointerType(CompileLlvmFunctionType(ctx, typeFunction), 0);

	functionRef = LLVMBuildPointerCast(ctx.builder, functionRef, functionType, "to_func_type");

	LLVMValueRef result = LLVMBuildCall(ctx.builder, functionRef, arguments.data, arguments.count, "");

	if(isStructReturnType)
	{
		LLVMAddCallSiteAttribute(result, 1, LLVMCreateEnumAttribute(ctx.context, LLVMGetEnumAttributeKindForName("sret", unsigned(strlen("sret"))), 0));

		result = LLVMBuildLoad(ctx.builder, resultStorage, "");
	}

	return CheckType(ctx, node, ConvertToStackType(ctx, result, node->type));
}